

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_NtkIncTravId(Acb_Ntk_t *p)

{
  if ((p->vObjTrav).nSize < 1) {
    Vec_IntFill(&p->vObjTrav,(p->vObjType).nCap,0);
  }
  p->nObjTravs = p->nObjTravs + 1;
  return;
}

Assistant:

static inline void           Acb_NtkIncTravId( Acb_Ntk_t * p )                       { if ( !Acb_NtkHasObjTravs(p) ) Acb_NtkCleanObjTravs(p); p->nObjTravs++;                               }